

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void invokeProfileCallback(sqlite3 *db,Vdbe *p)

{
  long local_28;
  sqlite3_int64 iElapse;
  sqlite3_int64 iNow;
  Vdbe *p_local;
  sqlite3 *db_local;
  
  iNow = (sqlite3_int64)p;
  p_local = (Vdbe *)db;
  sqlite3OsCurrentTimeInt64(db->pVfs,&iElapse);
  local_28 = (iElapse - *(long *)(iNow + 0xb0)) * 1000000;
  if (*(long *)(p_local->aCounter + 5) != 0) {
    (**(code **)(p_local->aCounter + 5))(p_local->zSql,*(undefined8 *)(iNow + 0xe8),local_28);
  }
  if ((p_local->nStmtDefCons & 0x200000000) != 0) {
    (**(code **)(p_local->aCounter + 1))(2,*(undefined8 *)(p_local->aCounter + 3),iNow,&local_28);
  }
  *(undefined8 *)(iNow + 0xb0) = 0;
  return;
}

Assistant:

static SQLITE_NOINLINE void invokeProfileCallback(sqlite3 *db, Vdbe *p){
  sqlite3_int64 iNow;
  sqlite3_int64 iElapse;
  assert( p->startTime>0 );
  assert( db->xProfile!=0 || (db->mTrace & SQLITE_TRACE_PROFILE)!=0 );
  assert( db->init.busy==0 );
  assert( p->zSql!=0 );
  sqlite3OsCurrentTimeInt64(db->pVfs, &iNow);
  iElapse = (iNow - p->startTime)*1000000;
  if( db->xProfile ){
    db->xProfile(db->pProfileArg, p->zSql, iElapse);
  }
  if( db->mTrace & SQLITE_TRACE_PROFILE ){
    db->xTrace(SQLITE_TRACE_PROFILE, db->pTraceArg, p, (void*)&iElapse);
  }
  p->startTime = 0;
}